

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O2

string * __thiscall
cmCMakePresetsErrors::getVariableName_abi_cxx11_
          (string *__return_storage_ptr__,cmCMakePresetsErrors *this,cmJSONState *state)

{
  cmJSONState *state_00;
  string var;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"cacheVariables",(allocator<char> *)&local_50);
  cmJSONState::key_after(&local_30,(cmJSONState *)this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  cmStrCat<char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
            (__return_storage_ptr__,(char (*) [11])0x6b8600,&local_30,(char (*) [2])0x6a2b8e);
  getPresetName_abi_cxx11_(&local_50,this,state_00);
  cmStrCat<std::__cxx11::string&,char_const(&)[14],std::__cxx11::string,char_const(&)[2]>
            (&local_70,__return_storage_ptr__,(char (*) [14])0x6c8fc4,&local_50,
             (char (*) [2])0x6a2b8e);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string getVariableName(cmJSONState* state)
{
  std::string var = state->key_after("cacheVariables");
  std::string errMsg = cmStrCat("variable \"", var, "\"");
  errMsg = cmStrCat(errMsg, " for preset \"", getPresetName(state), "\"");
  return errMsg;
}